

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_Encode2(CLzmaEnc *p,ICompressProgress *progress)

{
  int iVar1;
  undefined8 *in_RSI;
  CLzmaEncHandle in_RDI;
  SRes res;
  UInt32 in_stack_0000004c;
  UInt32 in_stack_00000050;
  Bool_conflict in_stack_00000054;
  CLzmaEnc *in_stack_00000058;
  SRes local_14;
  
  do {
    local_14 = LzmaEnc_CodeOneBlock
                         (in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_0000004c);
    if ((local_14 != 0) || (*(int *)((long)in_RDI + 0x88) != 0)) goto LAB_0011a596;
  } while ((in_RSI == (undefined8 *)0x0) ||
          (iVar1 = (*(code *)*in_RSI)(in_RSI,*(undefined8 *)((long)in_RDI + 0x98),
                                      *(long *)((long)in_RDI + 0xf0) +
                                      (*(long *)((long)in_RDI + 0xd0) -
                                      *(long *)((long)in_RDI + 0xe0)) +
                                      *(long *)((long)in_RDI + 200)), iVar1 == 0));
  local_14 = 10;
LAB_0011a596:
  LzmaEnc_Finish(in_RDI);
  return local_14;
}

Assistant:

static SRes LzmaEnc_Encode2(CLzmaEnc *p, ICompressProgress *progress)
{
  SRes res = SZ_OK;

  #ifndef _7ZIP_ST
  Byte allocaDummy[0x300];
  allocaDummy[0] = 0;
  allocaDummy[1] = allocaDummy[0];
  #endif

  for (;;)
  {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished)
      break;
    if (progress)
    {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK)
      {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  
  LzmaEnc_Finish(p);

  /*
  if (res == S_OK && !Inline_MatchFinder_IsFinishedOK(&p->matchFinderBase))
    res = SZ_ERROR_FAIL;
  }
  */

  return res;
}